

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O2

void GD::save_load_online_state<dense_parameters>
               (vw *all,io_buf *model_file,bool read,bool text,gd *g,stringstream *msg,
               dense_parameters *weights)

{
  float *data;
  byte bVar1;
  ulong uVar2;
  size_t sVar3;
  size_t sVar4;
  weight *pwVar5;
  ostream *poVar6;
  vw_exception *this;
  uint32_t uVar7;
  long lVar8;
  float *pfVar9;
  undefined7 in_register_00000011;
  uint64_t *data_00;
  weight *pwVar10;
  size_t sStack_230;
  uint32_t old_i;
  uint64_t i;
  uint local_214;
  io_buf *local_210;
  stringstream *local_208;
  weight *local_200;
  vw *local_1f8;
  stringstream *local_1f0;
  long local_1e8;
  long local_1e0;
  string local_1d8;
  weight buff [4];
  ostream local_1a8;
  
  uVar7 = all->num_bits;
  i = 0;
  old_i = 0;
  local_210 = model_file;
  local_1f8 = all;
  if ((int)CONCAT71(in_register_00000011,read) == 0) {
    uVar7 = weights->_stride_shift;
    local_1e0 = 1L << ((byte)uVar7 & 0x3f);
    pwVar5 = weights->_begin;
    local_208 = msg + 0x10;
    local_1e8 = local_1e0 * 4;
    local_214 = (uint)text;
    pwVar10 = pwVar5;
    local_200 = pwVar5;
    local_1f0 = msg;
    for (lVar8 = 0; data = (float *)((long)local_200 + lVar8),
        data != pwVar5 + weights->_weight_mask + 1; lVar8 = lVar8 + local_1e8) {
      if ((*data != 0.0) || (NAN(*data))) {
        i = (ulong)(lVar8 >> 2) >> ((byte)uVar7 & 0x3f);
        std::ostream::_M_insert<unsigned_long>((ulong)local_208);
        if (local_1f8->num_bits < 0x1f) {
          old_i = (uint32_t)i;
          data_00 = (uint64_t *)&old_i;
          sStack_230 = 4;
        }
        else {
          data_00 = &i;
          sStack_230 = 8;
        }
        bin_text_write_fixed(local_210,(char *)data_00,sStack_230,msg,SUB41(local_214,0));
        if (g == (gd *)0x0) {
LAB_001459f8:
          poVar6 = std::operator<<((ostream *)local_208,":");
          sStack_230 = 4;
          pfVar9 = data;
        }
        else {
          if (g->adaptive == false) {
            if (g->normalized == false) goto LAB_001459f8;
          }
          else if (g->normalized != false) {
            poVar6 = std::operator<<((ostream *)local_208,":");
            pwVar5 = local_200;
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,*(float *)((long)local_200 + lVar8))
            ;
            poVar6 = std::operator<<(poVar6," ");
            poVar6 = (ostream *)
                     std::ostream::operator<<(poVar6,*(float *)((long)pwVar5 + lVar8 + 4));
            poVar6 = std::operator<<(poVar6," ");
            sStack_230 = 0xc;
            pfVar9 = pwVar10 + 2;
            goto LAB_00145a0e;
          }
          poVar6 = std::operator<<((ostream *)local_208,":");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,*data);
          poVar6 = std::operator<<(poVar6," ");
          sStack_230 = 8;
          pfVar9 = pwVar10 + 1;
        }
LAB_00145a0e:
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,*pfVar9);
        std::operator<<(poVar6,"\n");
        msg = local_1f0;
        bin_text_write_fixed(local_210,(char *)data,sStack_230,local_1f0,SUB41(local_214,0));
      }
      pwVar10 = pwVar10 + local_1e0;
      pwVar5 = weights->_begin;
      uVar7 = weights->_stride_shift;
    }
  }
  else {
    do {
      if (local_1f8->num_bits < 0x1f) {
        sVar3 = io_buf::bin_read_fixed(local_210,(char *)&old_i,4,"");
        i = (uint64_t)old_i;
      }
      else {
        sVar3 = io_buf::bin_read_fixed(local_210,(char *)&i,8,"");
      }
      if (sVar3 == 0) {
        return;
      }
      if ((ulong)(1L << ((byte)uVar7 & 0x3f)) <= i) {
        std::__cxx11::stringstream::stringstream((stringstream *)buff);
        poVar6 = std::operator<<(&local_1a8,"Model content is corrupted, weight vector index ");
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        poVar6 = std::operator<<(poVar6," must be less than total vector length ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        this = (vw_exception *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        VW::vw_exception::vw_exception
                  (this,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/gd.cc"
                   ,0x314,&local_1d8);
        __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      buff[0] = 0.0;
      buff[1] = 0.0;
      buff[2] = 0.0;
      buff[3] = 0.0;
      sVar4 = 4;
      if (g != (gd *)0x0) {
        if (g->adaptive == false) {
          if (g->normalized != false) goto LAB_00145827;
        }
        else {
          sVar4 = 0xc;
          if (g->normalized == false) {
LAB_00145827:
            sVar4 = 8;
          }
        }
      }
      sVar4 = io_buf::bin_read_fixed(local_210,(char *)buff,sVar4,"");
      bVar1 = (byte)weights->_stride_shift;
      uVar2 = weights->_weight_mask;
      pwVar10 = weights->_begin;
      for (lVar8 = 0; 1L << (bVar1 & 0x3f) != lVar8; lVar8 = lVar8 + 1) {
        pwVar10[(i << (bVar1 & 0x3f) & uVar2) + lVar8] = buff[lVar8];
      }
    } while (sVar3 + sVar4 != 0);
  }
  return;
}

Assistant:

void save_load_online_state(vw& all, io_buf& model_file, bool read, bool text, gd* g, stringstream& msg, T& weights)
{
  uint64_t length = (uint64_t)1 << all.num_bits;

  uint64_t i = 0;
  uint32_t old_i = 0;
  size_t brw = 1;

  if (read)
    do
    {
      brw = 1;
      if (all.num_bits < 31)  // backwards compatible
      {
        brw = model_file.bin_read_fixed((char*)&old_i, sizeof(old_i), "");
        i = old_i;
      }
      else
        brw = model_file.bin_read_fixed((char*)&i, sizeof(i), "");
      if (brw > 0)
      {
        if (i >= length)
          THROW("Model content is corrupted, weight vector index " << i << " must be less than total vector length "
                                                                   << length);
        weight buff[4] = {0, 0, 0, 0};
        if (g == NULL || (!g->adaptive && !g->normalized))
          brw += model_file.bin_read_fixed((char*)buff, sizeof(buff[0]), "");
        else if ((g->adaptive && !g->normalized) || (!g->adaptive && g->normalized))
          brw += model_file.bin_read_fixed((char*)buff, sizeof(buff[0]) * 2, "");
        else  // adaptive and normalized
          brw += model_file.bin_read_fixed((char*)buff, sizeof(buff[0]) * 3, "");
        uint32_t stride = 1 << weights.stride_shift();
        weight* v = &weights.strided_index(i);
        for (size_t i = 0; i < stride; i++) v[i] = buff[i];
      }
    } while (brw > 0);
  else  // write binary or text
    for (typename T::iterator v = weights.begin(); v != weights.end(); ++v)
      if (*v != 0.)
      {
        i = v.index() >> weights.stride_shift();
        msg << i;
        if (all.num_bits < 31)
        {
          old_i = (uint32_t)i;
          brw = bin_text_write_fixed(model_file, (char*)&old_i, sizeof(old_i), msg, text);
        }
        else
          brw = bin_text_write_fixed(model_file, (char*)&i, sizeof(i), msg, text);

        if (g == nullptr || (!g->adaptive && !g->normalized))
        {
          msg << ":" << *v << "\n";
          brw += bin_text_write_fixed(model_file, (char*)&(*v), sizeof(*v), msg, text);
        }
        else if ((g->adaptive && !g->normalized) || (!g->adaptive && g->normalized))
        {
          // either adaptive or normalized
          msg << ":" << *v << " " << (&(*v))[1] << "\n";
          brw += bin_text_write_fixed(model_file, (char*)&(*v), 2 * sizeof(*v), msg, text);
        }
        else
        {
          // adaptive and normalized
          msg << ":" << *v << " " << (&(*v))[1] << " " << (&(*v))[2] << "\n";
          brw += bin_text_write_fixed(model_file, (char*)&(*v), 3 * sizeof(*v), msg, text);
        }
      }
}